

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bounding_rect.h
# Opt level: O2

bool agg::bounding_rect_single<agg::gsv_text,double>
               (gsv_text *vs,uint path_id,double *x1,double *y1,double *x2,double *y2)

{
  uint uVar1;
  bool bVar2;
  undefined4 in_register_00000034;
  double y;
  double x;
  double local_40;
  double local_38;
  
  *x1 = 1.0;
  *y1 = 1.0;
  *x2 = 0.0;
  *y2 = 0.0;
  gsv_text::rewind(vs,(FILE *)CONCAT44(in_register_00000034,path_id));
  bVar2 = true;
LAB_001125ee:
  uVar1 = gsv_text::vertex(vs,&local_38,&local_40);
  if (uVar1 == 0) {
    if (*x1 <= *x2) {
      bVar2 = *y1 <= *y2;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  if (!bVar2) goto LAB_00112628;
  *x1 = local_38;
  *y1 = local_40;
  *x2 = local_38;
  goto LAB_00112664;
LAB_00112628:
  if (local_38 < *x1) {
    *x1 = local_38;
  }
  if (local_40 < *y1) {
    *y1 = local_40;
  }
  if (*x2 <= local_38 && local_38 != *x2) {
    *x2 = local_38;
  }
  bVar2 = false;
  if (*y2 <= local_40 && local_40 != *y2) {
LAB_00112664:
    *y2 = local_40;
    bVar2 = false;
  }
  goto LAB_001125ee;
}

Assistant:

bool bounding_rect_single(VertexSource& vs, unsigned path_id,
                              CoordT* x1, CoordT* y1, CoordT* x2, CoordT* y2)
    {
        double x;
        double y;
        bool first = true;

        *x1 = CoordT(1);
        *y1 = CoordT(1);
        *x2 = CoordT(0);
        *y2 = CoordT(0);

        vs.rewind(path_id);
        unsigned cmd;
        while(!is_stop(cmd = vs.vertex(&x, &y)))
        {
            if(is_vertex(cmd))
            {
                if(first)
                {
                    *x1 = CoordT(x);
                    *y1 = CoordT(y);
                    *x2 = CoordT(x);
                    *y2 = CoordT(y);
                    first = false;
                }
                else
                {
                    if(CoordT(x) < *x1) *x1 = CoordT(x);
                    if(CoordT(y) < *y1) *y1 = CoordT(y);
                    if(CoordT(x) > *x2) *x2 = CoordT(x);
                    if(CoordT(y) > *y2) *y2 = CoordT(y);
                }
            }
        }
        return *x1 <= *x2 && *y1 <= *y2;
    }